

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O0

Am_Object __thiscall
Am_Connection::Get_Net_Instance(Am_Connection *this,char *proto_name,int instance_num)

{
  char *initial;
  Am_Value local_40;
  Am_Value_List local_30;
  undefined1 local_1d;
  int local_1c;
  char *pcStack_18;
  int instance_num_local;
  char *proto_name_local;
  Am_Object *obj;
  
  local_1d = 0;
  local_1c = instance_num;
  pcStack_18 = proto_name;
  proto_name_local = (char *)this;
  Am_Object::Am_Object((Am_Object *)this);
  initial = Net_ID_Str(pcStack_18,local_1c);
  Am_Value::Am_Value(&local_40,initial);
  Am_Value_List::Assoc_2(&local_30,(Am_Value *)&Net_Instances);
  Am_Object::operator=((Am_Object *)this,(Am_Value *)&local_30);
  Am_Value::~Am_Value((Am_Value *)&local_30);
  Am_Value::~Am_Value(&local_40);
  return (Am_Object)(Am_Object_Data *)this;
}

Assistant:

Am_Object
Am_Connection::Get_Net_Instance(const char *proto_name, int instance_num)
{
  Am_Object obj;
  obj = Net_Instances.Assoc_2(Net_ID_Str(proto_name, instance_num));
  return obj;
}